

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMap.h
# Opt level: O0

void __thiscall
Minisat::IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
          (IntSet<Minisat::Lit,_Minisat::MkIndexLit> *this,bool free)

{
  Size SVar1;
  Lit *pLVar2;
  char *pcVar3;
  int local_18;
  int i;
  bool free_local;
  IntSet<Minisat::Lit,_Minisat::MkIndexLit> *this_local;
  
  if (free) {
    IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::clear(&this->in_set,true);
  }
  else {
    for (local_18 = 0; SVar1 = vec<Minisat::Lit,_int>::size(&this->xs), local_18 < SVar1;
        local_18 = local_18 + 1) {
      pLVar2 = vec<Minisat::Lit,_int>::operator[](&this->xs,local_18);
      pcVar3 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[]
                         (&this->in_set,(Lit)pLVar2->x);
      *pcVar3 = '\0';
    }
  }
  vec<Minisat::Lit,_int>::clear(&this->xs,free);
  return;
}

Assistant:

void     clear       (bool free = false){
            if (free)
                in_set.clear(true); 
            else
                for (int i = 0; i < xs.size(); i++)
                    in_set[xs[i]] = 0;
            xs.clear(free);
        }